

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

int64_t tar_atol_base_n(char *p,size_t char_cnt,wchar_t base)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  int64_t iVar5;
  long lVar6;
  size_t sVar7;
  byte bVar8;
  wchar_t wVar9;
  long lVar10;
  byte *pbVar11;
  ulong uVar12;
  bool bVar13;
  
  iVar5 = 0x7fffffffffffffff;
  uVar12 = CONCAT44(0,base);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
  lVar4 = SUB168(auVar3 / auVar2,0);
  lVar6 = SUB168(auVar3 % auVar2,0);
  if (char_cnt != 0) {
    pbVar1 = (byte *)(p + char_cnt);
    pbVar11 = (byte *)p;
    do {
      p = (char *)pbVar11;
      bVar8 = *p;
      if ((bVar8 != 9) && (bVar8 != 0x20)) {
        bVar13 = bVar8 == 0x2d;
        if (bVar13) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
          auVar2 = auVar3 << 0x40 | ZEXT816(0x8000000000000000);
          p = (char *)((byte *)p + 1);
          char_cnt = char_cnt - 1;
          lVar4 = -SUB168(auVar2 / SEXT816((long)uVar12),0);
          lVar6 = -SUB168(auVar2 % SEXT816((long)uVar12),0);
          iVar5 = -0x8000000000000000;
        }
        goto LAB_00137a13;
      }
      pbVar11 = (byte *)p + 1;
      char_cnt = char_cnt - 1;
      p = (char *)pbVar1;
    } while (char_cnt != 0);
  }
  char_cnt = 0;
  bVar13 = false;
LAB_00137a13:
  if ((char_cnt == 0) || (bVar8 = *p, (char)bVar8 < '0')) {
    lVar10 = 0;
  }
  else {
    sVar7 = 0;
    lVar10 = 0;
    do {
      wVar9 = (uint)bVar8 + L'\xffffffd0';
      if ((base <= wVar9) || (char_cnt == sVar7)) break;
      if (lVar4 < lVar10) {
        return iVar5;
      }
      if ((lVar10 == lVar4) && (lVar6 <= (long)(ulong)(uint)wVar9)) {
        return iVar5;
      }
      lVar10 = lVar10 * uVar12 + (ulong)(uint)wVar9;
      bVar8 = ((byte *)p)[sVar7 + 1];
      sVar7 = sVar7 + 1;
    } while ('/' < (char)bVar8);
  }
  lVar4 = -lVar10;
  if (!bVar13) {
    lVar4 = lVar10;
  }
  return lVar4;
}

Assistant:

static int64_t
tar_atol_base_n(const char *p, size_t char_cnt, int base)
{
	int64_t	l, maxval, limit, last_digit_limit;
	int digit, sign;

	maxval = INT64_MAX;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/* the pointer will not be dereferenced if char_cnt is zero
	 * due to the way the && operator is evaluated.
	 */
	while (char_cnt != 0 && (*p == ' ' || *p == '\t')) {
		p++;
		char_cnt--;
	}

	sign = 1;
	if (char_cnt != 0 && *p == '-') {
		sign = -1;
		p++;
		char_cnt--;

		maxval = INT64_MIN;
		limit = -(INT64_MIN / base);
		last_digit_limit = -(INT64_MIN % base);
	}

	l = 0;
	if (char_cnt != 0) {
		digit = *p - '0';
		while (digit >= 0 && digit < base  && char_cnt != 0) {
			if (l>limit || (l == limit && digit >= last_digit_limit)) {
				return maxval; /* Truncate on overflow. */
			}
			l = (l * base) + digit;
			digit = *++p - '0';
			char_cnt--;
		}
	}
	return (sign < 0) ? -l : l;
}